

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

void whisper_print_usage(int param_1,char **argv,whisper_params *params)

{
  FILE *__stream;
  undefined8 uVar1;
  uint *in_RDX;
  char *pcVar2;
  undefined8 *in_RSI;
  
  fprintf(_stderr,"\n");
  fprintf(_stderr,"usage: %s [options]\n",*in_RSI);
  fprintf(_stderr,"\n");
  fprintf(_stderr,"options:\n");
  fprintf(_stderr,"  -h,       --help        [default] show this help message and exit\n");
  fprintf(_stderr,"  -t N,     --threads N   [%-7d] number of threads to use during computation\n",
          (ulong)*in_RDX);
  __stream = _stderr;
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"  -m FNAME, --model FNAME [%-7s] model path\n",uVar1);
  fprintf(_stderr,"  -w N,     --what N      [%-7d] what to benchmark:\n",(ulong)in_RDX[1]);
  fprintf(_stderr,"                           %-7s  0 - whisper\n","");
  fprintf(_stderr,"                           %-7s  1 - memcpy\n","");
  fprintf(_stderr,"                           %-7s  2 - ggml_mul_mat\n","");
  pcVar2 = "true";
  if ((in_RDX[10] & 1) != 0) {
    pcVar2 = "false";
  }
  fprintf(_stderr,"  -ng,      --no-gpu      [%-7s] disable GPU\n",pcVar2);
  pcVar2 = "false";
  if ((*(byte *)((long)in_RDX + 0x29) & 1) != 0) {
    pcVar2 = "true";
  }
  fprintf(_stderr,"  -fa,      --flash-attn  [%-7s] enable flash attention\n",pcVar2);
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void whisper_print_usage(int /*argc*/, char ** argv, const whisper_params & params) {
    fprintf(stderr, "\n");
    fprintf(stderr, "usage: %s [options]\n", argv[0]);
    fprintf(stderr, "\n");
    fprintf(stderr, "options:\n");
    fprintf(stderr, "  -h,       --help        [default] show this help message and exit\n");
    fprintf(stderr, "  -t N,     --threads N   [%-7d] number of threads to use during computation\n", params.n_threads);
    fprintf(stderr, "  -m FNAME, --model FNAME [%-7s] model path\n",                                  params.model.c_str());
    fprintf(stderr, "  -w N,     --what N      [%-7d] what to benchmark:\n",                          params.what);
    fprintf(stderr, "                           %-7s  0 - whisper\n",                                 "");
    fprintf(stderr, "                           %-7s  1 - memcpy\n",                                  "");
    fprintf(stderr, "                           %-7s  2 - ggml_mul_mat\n",                            "");
    fprintf(stderr, "  -ng,      --no-gpu      [%-7s] disable GPU\n",                                 params.use_gpu ? "false" : "true");
    fprintf(stderr, "  -fa,      --flash-attn  [%-7s] enable flash attention\n",                      params.flash_attn ? "true" : "false");
    fprintf(stderr, "\n");
}